

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::ProcessTryHandlerBailout
          (InterpreterStackFrame *this,EHBailoutData *ehBailoutData,uint32 tryNestingDepth)

{
  InterpreterStackFrame *pIVar1;
  short sVar2;
  int byteOffset;
  PVOID tryHandlerAddrOfReturnAddr;
  code *pcVar3;
  bool bVar4;
  OpCode OVar5;
  uint byteOffset_00;
  int iVar6;
  JavascriptExceptionObject *exceptionObject;
  undefined4 *puVar7;
  OpLayoutBrLong *pOVar8;
  ScriptContext *scriptContext;
  undefined1 local_40 [8];
  AutoCatchHandlerExists autoCatchHandlerExists;
  
  iVar6 = ehBailoutData->catchOffset;
  byteOffset = ehBailoutData->finallyOffset;
  if (iVar6 == 0 && byteOffset == 0) {
    if (ehBailoutData->ht != HT_Finally) {
      if (ehBailoutData->ht == HT_Catch) {
        *(short *)(this + 0xde) = *(short *)(this + 0xde) + 1;
        this[0xd4] = (InterpreterStackFrame)((byte)this[0xd4] | 2);
        if (tryNestingDepth != 0) {
          ProcessTryHandlerBailout(this,ehBailoutData->child,tryNestingDepth - 1);
        }
        ProcessCatch(this);
        pIVar1 = this + 0xde;
        sVar2 = *(short *)pIVar1;
        *(short *)pIVar1 = *(short *)pIVar1 + -1;
        if (sVar2 != 0) {
          return;
        }
        this[0xd4] = (InterpreterStackFrame)((byte)this[0xd4] & 0xfd);
        return;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x1b10,"(ehBailoutData->ht == HandlerType::HT_Finally)",
                                  "ehBailoutData->ht == HandlerType::HT_Finally");
      if (!bVar4) {
LAB_00955156:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
    }
    *(short *)(this + 0xe4) = *(short *)(this + 0xe4) + 1;
    this[0xd4] = (InterpreterStackFrame)((byte)this[0xd4] | 4);
    if (tryNestingDepth != 0) {
      ProcessTryHandlerBailout(this,ehBailoutData->child,tryNestingDepth - 1);
    }
    exceptionObject =
         ThreadContext::GetPendingFinallyException
                   (*(ThreadContext **)(*(long *)(this + 0x78) + 0x3b8));
    ThreadContext::SetPendingFinallyException
              (*(ThreadContext **)(*(long *)(this + 0x78) + 0x3b8),(JavascriptExceptionObject *)0x0)
    ;
    iVar6 = ProcessFinally(this);
    pIVar1 = this + 0xe4;
    sVar2 = *(short *)pIVar1;
    *(short *)pIVar1 = *(short *)pIVar1 + -1;
    if (sVar2 == 0) {
      this[0xd4] = (InterpreterStackFrame)((byte)this[0xd4] & 0xfb);
    }
    if (exceptionObject != (JavascriptExceptionObject *)0x0 && iVar6 == 0) {
      scriptContext = *(ScriptContext **)(this + 0x78);
      tryHandlerAddrOfReturnAddr = scriptContext->threadContext->tryHandlerAddrOfReturnAddr;
      if (tryHandlerAddrOfReturnAddr != (PVOID)0x0) {
        JavascriptExceptionOperators::WalkStackForCleaningUpInlineeInfo
                  (scriptContext,(PVOID)0x0,tryHandlerAddrOfReturnAddr);
        scriptContext = *(ScriptContext **)(this + 0x78);
      }
      JavascriptExceptionOperators::DoThrow(exceptionObject,scriptContext);
    }
    if (iVar6 != 0) {
      ByteCodeReader::SetCurrentOffset((ByteCodeReader *)this,iVar6);
      return;
    }
  }
  else {
    *(short *)(this + 0xdc) = *(short *)(this + 0xdc) + 1;
    *(ushort *)(this + 0xd4) = (ushort)(byteOffset != 0) << 8 | *(ushort *)(this + 0xd4) | 1;
    if (tryNestingDepth != 0) {
      ProcessTryHandlerBailout(this,ehBailoutData->child,tryNestingDepth - 1);
    }
    if (iVar6 != 0) {
      JavascriptExceptionOperators::AutoCatchHandlerExists::AutoCatchHandlerExists
                ((AutoCatchHandlerExists *)local_40,*(ScriptContext **)(this + 0x78),true);
      JavascriptExceptionOperators::AutoCatchHandlerExists::~AutoCatchHandlerExists
                ((AutoCatchHandlerExists *)local_40);
    }
    bVar4 = IsInDebugMode(this);
    if (bVar4) {
      if (*(char *)(*(long *)(this + 0x78) + 0x143f) == '\x01') {
        ProcessWithDebugging_PreviousStmtTracking(this);
      }
      else {
        ProcessWithDebugging(this);
      }
    }
    else {
      Process(this);
    }
    TrySetRetOffset(this);
    pIVar1 = this + 0xdc;
    sVar2 = *(short *)pIVar1;
    *(short *)pIVar1 = *(short *)pIVar1 + -1;
    if (sVar2 == 0) {
      *(ushort *)(this + 0xd4) = *(ushort *)(this + 0xd4) & 0xfefe;
    }
    if (byteOffset != 0) {
      byteOffset_00 = ByteCodeReader::GetCurrentOffset((ByteCodeReader *)this);
      ByteCodeReader::SetCurrentOffset((ByteCodeReader *)this,byteOffset);
      *(short *)(this + 0xe4) = *(short *)(this + 0xe4) + 1;
      this[0xd4] = (InterpreterStackFrame)((byte)this[0xd4] | 4);
      OVar5 = ByteCodeReader::ReadOp((ByteCodeReader *)this,(LayoutSize *)local_40);
      if (OVar5 == BrLong) {
        if (local_40._0_4_ != SmallLayout) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                      ,0x1ba2,"(layoutSize == SmallLayout)",
                                      "layoutSize == SmallLayout");
          if (!bVar4) goto LAB_00955156;
          *puVar7 = 0;
        }
        pOVar8 = ByteCodeReader::BrLong((ByteCodeReader *)this);
        ByteCodeReader::SetCurrentRelativeOffset
                  ((ByteCodeReader *)this,(byte *)(pOVar8 + 1),pOVar8->RelativeJumpOffset);
        OVar5 = ByteCodeReader::ReadOp((ByteCodeReader *)this,(LayoutSize *)local_40);
      }
      if (OVar5 != Finally) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0x1ba8,"(finallyOp == Js::OpCode::Finally)",
                                    "finallyOp == Js::OpCode::Finally");
        if (!bVar4) goto LAB_00955156;
        *puVar7 = 0;
      }
      iVar6 = ProcessFinally(this);
      pIVar1 = this + 0xe4;
      sVar2 = *(short *)pIVar1;
      *(short *)pIVar1 = *(short *)pIVar1 + -1;
      if (sVar2 == 0) {
        this[0xd4] = (InterpreterStackFrame)((byte)this[0xd4] & 0xfb);
      }
      if (iVar6 == 0) {
        ByteCodeReader::SetCurrentOffset((ByteCodeReader *)this,byteOffset_00);
      }
    }
  }
  return;
}

Assistant:

void InterpreterStackFrame::ProcessTryHandlerBailout(EHBailoutData * ehBailoutData, uint32 tryNestingDepth)
    {
        int catchOffset = ehBailoutData->catchOffset;
        int finallyOffset = ehBailoutData->finallyOffset;
        Js::JavascriptExceptionObject* exception = NULL;

        if (catchOffset != 0 || finallyOffset != 0)
        {
            try
            {
                this->nestedTryDepth++;
                // mark the stackFrame as 'in try block'
                this->OrFlags(InterpreterStackFrameFlags_WithinTryBlock);

                if (finallyOffset != 0)
                {
                    this->OrFlags(InterpreterStackFrameFlags_WithinTryFinallyBlock);
                }

                if (tryNestingDepth != 0)
                {
                    this->ProcessTryHandlerBailout(ehBailoutData->child, --tryNestingDepth);
                }

                if (catchOffset != 0)
                {
                    Js::JavascriptExceptionOperators::AutoCatchHandlerExists autoCatchHandlerExists(scriptContext);
                }

#ifdef ENABLE_SCRIPT_DEBUGGING
                if (this->IsInDebugMode())
                {
#if ENABLE_TTD
                    if (SHOULD_DO_TTD_STACK_STMT_OP(this->scriptContext))
                    {
                        this->ProcessWithDebugging_PreviousStmtTracking();
                    }
                    else
                    {
                        this->ProcessWithDebugging();
                    }
#else
                    this->ProcessWithDebugging();
#endif

                    this->TrySetRetOffset();
                }
                else
#endif
                {
                    this->Process();
                    this->TrySetRetOffset();
                }
            }
            catch (const Js::JavascriptException& err)
            {
                // We are using C++ exception handling which does not unwind the stack in the catch block.
                // For stack overflow and OOM exceptions, we cannot run user code here because the stack is not unwind.
                exception = err.GetAndClear();
            }
        }
        else if (ehBailoutData->ht == HandlerType::HT_Catch)
        {
            this->nestedCatchDepth++;
            // mark the stackFrame as 'in catch block'
            this->OrFlags(InterpreterStackFrameFlags_WithinCatchBlock);

            if (tryNestingDepth != 0)
            {
                this->ProcessTryHandlerBailout(ehBailoutData->child, --tryNestingDepth);
            }
            this->ProcessCatch();

            if (--this->nestedCatchDepth == -1)
            {
                // unmark the stackFrame as 'in catch block'
                this->ClearFlags(InterpreterStackFrameFlags_WithinCatchBlock);
            }
            return;
        }
        else
        {
            Assert(ehBailoutData->ht == HandlerType::HT_Finally);
            this->nestedFinallyDepth++;
            // mark the stackFrame as 'in finally block'
            this->OrFlags(InterpreterStackFrameFlags_WithinFinallyBlock);

            if (tryNestingDepth != 0)
            {
                this->ProcessTryHandlerBailout(ehBailoutData->child, --tryNestingDepth);
            }

            Js::JavascriptExceptionObject * exceptionObj = this->scriptContext->GetThreadContext()->GetPendingFinallyException();
            this->scriptContext->GetThreadContext()->SetPendingFinallyException(nullptr);

            int finallyEndOffset = this->ProcessFinally();

            if (--this->nestedFinallyDepth == -1)
            {
                // unmark the stackFrame as 'in finally block'
                this->ClearFlags(InterpreterStackFrameFlags_WithinFinallyBlock);
            }

            // Finally exited with LeaveNull, We don't throw for early returns
            if (finallyEndOffset == 0 && exceptionObj)
            {
#if ENABLE_NATIVE_CODEGEN
                if (scriptContext->GetThreadContext()->GetTryHandlerAddrOfReturnAddr() != nullptr)
                {
                    JavascriptExceptionOperators::WalkStackForCleaningUpInlineeInfo(scriptContext, nullptr, scriptContext->GetThreadContext()->GetTryHandlerAddrOfReturnAddr());
                }
#endif
                JavascriptExceptionOperators::DoThrow(const_cast<Js::JavascriptExceptionObject *>(exceptionObj), scriptContext);
            }
            if (finallyEndOffset != 0)
            {
                m_reader.SetCurrentOffset(finallyEndOffset);
            }

            return;
        }

        if (--this->nestedTryDepth == -1)
        {
            // unmark the stackFrame as 'in try block'
            this->ClearFlags(InterpreterStackFrameFlags_WithinTryBlock | InterpreterStackFrameFlags_WithinTryFinallyBlock);
        }

        // Now that the stack is unwound, let's run the catch block.
        if (exception)
        {
            if (catchOffset != 0)
            {
                exception = exception->CloneIfStaticExceptionObject(scriptContext);
                // We've got a JS exception. Grab the exception object and assign it to the
                // catch object's location, then call the handler (i.e., we consume the Catch op here).
                Var catchObject = exception->GetThrownObject(scriptContext);

                m_reader.SetCurrentOffset(catchOffset);

                LayoutSize layoutSize;
                OpCode catchOp = m_reader.ReadOp(layoutSize);
#ifdef BYTECODE_BRANCH_ISLAND
                if (catchOp == Js::OpCode::BrLong)
                {
                    Assert(layoutSize == SmallLayout);
                    auto playoutBrLong = m_reader.BrLong();
                    m_reader.SetCurrentRelativeOffset((const byte *)(playoutBrLong + 1), playoutBrLong->RelativeJumpOffset);
                    catchOp = m_reader.ReadOp(layoutSize);
                }
#endif
                AssertMsg(catchOp == OpCode::Catch, "Catch op not found at catch offset");
                RegSlot reg = layoutSize == SmallLayout ? m_reader.Reg1_Small()->R0 :
                    layoutSize == MediumLayout ? m_reader.Reg1_Medium()->R0 : m_reader.Reg1_Large()->R0;
                SetReg(reg, catchObject);

                ResetOut();

                this->nestedCatchDepth++;
                // mark the stackFrame as 'in catch block'
                this->OrFlags(InterpreterStackFrameFlags_WithinCatchBlock);

                this->ProcessCatch();

                if (--this->nestedCatchDepth == -1)
                {
                    // unmark the stackFrame as 'in catch block'
                    this->ClearFlags(InterpreterStackFrameFlags_WithinCatchBlock);
                }
            }
            else
            {
                Assert(finallyOffset != 0);
                exception = exception->CloneIfStaticExceptionObject(scriptContext);

                m_reader.SetCurrentOffset(finallyOffset);

                ResetOut();

                this->nestedFinallyDepth++;
                // mark the stackFrame as 'in finally block'
                this->OrFlags(InterpreterStackFrameFlags_WithinFinallyBlock);

                LayoutSize layoutSize;
                OpCode finallyOp = m_reader.ReadOp(layoutSize);
#ifdef BYTECODE_BRANCH_ISLAND
                if (finallyOp == Js::OpCode::BrLong)
                {
                    Assert(layoutSize == SmallLayout);
                    auto playoutBrLong = m_reader.BrLong();
                    m_reader.SetCurrentRelativeOffset((const byte *)(playoutBrLong + 1), playoutBrLong->RelativeJumpOffset);
                    finallyOp = m_reader.ReadOp(layoutSize);
                }
#endif
                Assert(finallyOp == Js::OpCode::Finally);

                int finallyEndOffset = this->ProcessFinally();

                if (--this->nestedFinallyDepth == -1)
                {
                    // unmark the stackFrame as 'in finally block'
                    this->ClearFlags(InterpreterStackFrameFlags_WithinFinallyBlock);
                }
                if (finallyEndOffset == 0)
                {
                    JavascriptExceptionOperators::DoThrow(exception, scriptContext);
                }
                m_reader.SetCurrentOffset(finallyEndOffset);
            }
        }
        else
        {
            if (finallyOffset != 0)
            {
                int currOffset = m_reader.GetCurrentOffset();

                m_reader.SetCurrentOffset(finallyOffset);

                this->nestedFinallyDepth++;

                // mark the stackFrame as 'in finally block'
                this->OrFlags(InterpreterStackFrameFlags_WithinFinallyBlock);

                LayoutSize layoutSize;
                OpCode finallyOp = m_reader.ReadOp(layoutSize);
#ifdef BYTECODE_BRANCH_ISLAND
                if (finallyOp == Js::OpCode::BrLong)
                {
                    Assert(layoutSize == SmallLayout);
                    auto playoutBrLong = m_reader.BrLong();
                    m_reader.SetCurrentRelativeOffset((const byte *)(playoutBrLong + 1), playoutBrLong->RelativeJumpOffset);
                    finallyOp = m_reader.ReadOp(layoutSize);
                }
#endif
                Assert(finallyOp == Js::OpCode::Finally);

                int finallyEndOffset = this->ProcessFinally();

                if (--this->nestedFinallyDepth == -1)
                {
                    // unmark the stackFrame as 'in finally block'
                    this->ClearFlags(InterpreterStackFrameFlags_WithinFinallyBlock);
                }
                if (finallyEndOffset == 0)
                {
                    m_reader.SetCurrentOffset(currOffset);
                }
            }
        }
    }